

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpression.cpp
# Opt level: O1

void __thiscall hdc::LiteralExpression::LiteralExpression(LiteralExpression *this,Token *token)

{
  int iVar1;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_Statement.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_001970b8;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  iVar1 = token->line;
  (this->token).kind = token->kind;
  (this->token).line = iVar1;
  (this->token).column = token->column;
  std::__cxx11::string::_M_assign((string *)&(this->token).lexem);
  return;
}

Assistant:

LiteralExpression::LiteralExpression(Token token) {
    this->token = token;
}